

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clock.cpp
# Opt level: O2

Clock * Clock::getInstance(void)

{
  if (instance != (Clock *)0x0) {
    return instance;
  }
  instance = (Clock *)operator_new(0x10);
  instance->current_time = 0.0;
  instance->dt = 0.0;
  return instance;
}

Assistant:

Clock* Clock::getInstance()
{
    if (instance == 0) {
        instance = new Clock();
    }
    return instance;
}